

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentRunner.h
# Opt level: O2

void __thiscall
aeron::concurrent::AgentRunner<aeron::ClientConductor,_aeron::concurrent::SleepingIdleStrategy>::run
          (AgentRunner<aeron::ClientConductor,_aeron::concurrent::SleepingIdleStrategy> *this)

{
  SleepingIdleStrategy *this_00;
  int workCount;
  
  while (((this->m_running)._M_base._M_i & 1U) != 0) {
    this_00 = this->m_idleStrategy;
    workCount = ClientConductor::doWork(this->m_agent);
    SleepingIdleStrategy::idle(this_00,workCount);
  }
  return;
}

Assistant:

inline void run()
    {
        try
        {
            m_agent.onStart();
        }
        catch (const util::SourcedException &exception)
        {
            m_exceptionHandler(exception);
            m_running = false;
        }

        while (m_running)
        {
            try
            {
                m_idleStrategy.idle(m_agent.doWork());
            }
            catch (const util::SourcedException &exception)
            {
                m_exceptionHandler(exception);
            }
        }

        try
        {
            m_agent.onClose();
        }
        catch (const util::SourcedException &exception)
        {
            m_exceptionHandler(exception);
        }
    }